

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O0

void __thiscall sptk::reaper::FdFilter::~FdFilter(FdFilter *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  FFT *this_00;
  
  if ((void *)in_RDI[1] != (void *)0x0) {
    operator_delete__((void *)in_RDI[1]);
  }
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete__((void *)*in_RDI);
  }
  if ((void *)in_RDI[10] != (void *)0x0) {
    operator_delete__((void *)in_RDI[10]);
  }
  if ((void *)in_RDI[0xb] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0xb]);
  }
  if ((void *)in_RDI[0xc] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0xc]);
  }
  if ((void *)in_RDI[0xd] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0xd]);
  }
  if ((void *)in_RDI[2] != (void *)0x0) {
    operator_delete__((void *)in_RDI[2]);
  }
  this_00 = (FFT *)in_RDI[8];
  if (this_00 != (FFT *)0x0) {
    operator_delete__(this_00);
  }
  if ((void *)in_RDI[9] != (void *)0x0) {
    operator_delete__((void *)in_RDI[9]);
  }
  pvVar1 = (void *)in_RDI[0x11];
  if (pvVar1 != (void *)0x0) {
    FFT::~FFT(this_00);
    operator_delete(pvVar1);
  }
  return;
}

Assistant:

FdFilter::~FdFilter() {
  delete [] input_buffer_;
  delete [] output_buffer_;
  delete [] x_;
  delete [] y_;
  delete [] xf_;
  delete [] yf_;
  delete [] filter_coeffs_;
  delete [] leftovers_;
  delete [] output_delayed_;
  delete fft_;
}